

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,AssignStmt *stmt)

{
  iterator __position;
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong local_28;
  uint64_t stmt_hash;
  
  uVar2 = hash_var(stmt->left_);
  uVar3 = hash_var(stmt->right_);
  uVar4 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar2;
  bVar1 = (byte)(this->super_IRVisitor).level & 0x3f;
  local_28 = uVar4 << bVar1 | uVar4 >> 0x40 - bVar1;
  __position._M_current =
       (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->stmt_hashes_,__position
               ,&local_28);
  }
  else {
    *__position._M_current = local_28;
    (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        uint64_t stmt_hash = hash_var(stmt->left()) ^ (shift(hash_var(stmt->right()), 1));
        // based on level
        stmt_hash = shift(stmt_hash, level);
        stmt_hashes_.emplace_back(stmt_hash);
    }